

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsTrieElement::compareStringTo
          (UCharsTrieElement *this,UCharsTrieElement *other,UnicodeString *strings)

{
  int8_t iVar1;
  UnicodeString local_90;
  UnicodeString local_50;
  
  getString(&local_50,this,strings);
  getString(&local_90,other,strings);
  iVar1 = icu_63::UnicodeString::compare(&local_50,&local_90);
  icu_63::UnicodeString::~UnicodeString(&local_90);
  icu_63::UnicodeString::~UnicodeString(&local_50);
  return (int)iVar1;
}

Assistant:

int32_t
UCharsTrieElement::compareStringTo(const UCharsTrieElement &other, const UnicodeString &strings) const {
    return getString(strings).compare(other.getString(strings));
}